

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O1

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  pointer pVVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  pointer *__ptr;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [12];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> sphere;
  _Head_base<0UL,_embree::collide2::Mesh_*,_false> local_68;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  RTCScene local_40;
  ulong local_38;
  
  auVar18 = in_XMM1._4_12_;
  local_58 = r;
  local_68._M_head_impl = (Mesh *)operator_new(0x38);
  (local_68._M_head_impl)->_vptr_Mesh = (_func_int **)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_68._M_head_impl)->_vptr_Mesh = (_func_int **)&PTR__Mesh_002cebd0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_68._M_head_impl)->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (&(local_68._M_head_impl)->x_,((long)numPhi + -1) * (long)numTheta + 2);
  std::vector<Triangle,_std::allocator<Triangle>_>::resize
            (&(local_68._M_head_impl)->tris_,((long)numPhi + -1) * (long)numTheta * 2);
  auVar17._0_4_ = (float)numTheta;
  auVar17._4_12_ = auVar18;
  fVar16 = (float)numPhi;
  ((((local_68._M_head_impl)->x_).
    super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[0] = (p->field_0).m128[0];
  ((((local_68._M_head_impl)->x_).
    super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[1] = (p->field_0).m128[1] + local_58;
  ((((local_68._M_head_impl)->x_).
    super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[2] = (p->field_0).m128[2];
  local_40 = scene;
  if (numPhi < 2) {
    iVar4 = numPhi + -1;
  }
  else {
    auVar19._4_4_ = auVar18._0_4_;
    auVar19._0_4_ = auVar17._0_4_;
    auVar19._8_4_ = auVar18._4_4_;
    auVar19._12_4_ = auVar18._8_4_;
    auVar19 = rcpss(auVar19,auVar17);
    local_48 = (2.0 - auVar17._0_4_ * auVar19._0_4_) * auVar19._0_4_;
    auVar17 = rcpss(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
    local_44 = (2.0 - fVar16 * auVar17._0_4_) * auVar17._0_4_;
    local_38 = 0;
    do {
      iVar4 = (int)local_38;
      uVar3 = iVar4 + 1;
      local_38 = (ulong)uVar3;
      local_4c = (float)(int)uVar3 * 3.1415927 * local_44;
      local_5c = sinf(local_4c);
      local_54 = cosf(local_4c);
      if (0 < numTheta) {
        local_5c = local_5c * local_58;
        local_54 = local_54 * local_58;
        lVar11 = 0;
        do {
          local_4c = ((float)(int)lVar11 + (float)(int)lVar11) * 3.1415927 * local_48;
          pVVar1 = ((local_68._M_head_impl)->x_).
                   super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = numTheta * iVar4 + lVar11;
          local_50 = (p->field_0).m128[0];
          fVar16 = sinf(local_4c);
          pVVar1[lVar15 + 1].field_0.m128[0] = fVar16 * local_5c + local_50;
          pVVar1[lVar15 + 1].field_0.m128[1] = (p->field_0).m128[1] + local_54;
          local_50 = (p->field_0).m128[2];
          fVar16 = cosf(local_4c);
          pVVar1[lVar15 + 1].field_0.m128[2] = fVar16 * local_5c + local_50;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 < numTheta);
      }
      iVar4 = numPhi + -1;
    } while ((int)local_38 < iVar4);
  }
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start[(long)iVar4 * (long)numTheta + 1].field_0.m128[0] =
       (p->field_0).m128[0];
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)numTheta + 1].field_0.m128[1]
       = (p->field_0).m128[1] - local_58;
  ((local_68._M_head_impl)->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
  _M_impl.super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)numTheta + 1].field_0.m128[2]
       = (p->field_0).m128[2];
  if (numTheta < 1) {
    uVar7 = 0;
  }
  else {
    lVar11 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
      *(int *)((long)&(((local_68._M_head_impl)->tris_).
                       super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start)->v0 + lVar11) = (int)uVar7;
      *(undefined4 *)
       ((long)&(((local_68._M_head_impl)->tris_).
                super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->v1 + lVar11) = 0;
      *(int *)((long)&(((local_68._M_head_impl)->tris_).
                       super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start)->v2 + lVar11) =
           (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                (long)numTheta) + 1;
      lVar11 = lVar11 + 0xc;
    } while ((long)uVar7 < (long)numTheta);
  }
  iVar4 = (int)uVar7;
  if (2 < numPhi) {
    iVar12 = 0;
    iVar13 = 1;
    do {
      if (0 < numTheta) {
        lVar11 = (long)(int)uVar7 * 0xc;
        iVar4 = 1;
        do {
          iVar9 = numTheta * iVar12;
          iVar8 = iVar4 % numTheta;
          iVar5 = iVar9 + iVar8 + 1;
          iVar14 = numTheta * (iVar12 + 1);
          iVar10 = iVar13 * numTheta + iVar4;
          *(int *)((long)&(((local_68._M_head_impl)->tris_).
                           super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start)->v0 + lVar11) = iVar10;
          *(int *)((long)&(((local_68._M_head_impl)->tris_).
                           super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start)->v1 + lVar11) = iVar5;
          *(int *)((long)&(((local_68._M_head_impl)->tris_).
                           super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start)->v2 + lVar11) = iVar4 + iVar9;
          *(int *)((long)&((local_68._M_head_impl)->tris_).
                          super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                          super__Vector_impl_data._M_start[1].v0 + lVar11) = iVar8 + iVar14 + 1;
          *(int *)((long)&((local_68._M_head_impl)->tris_).
                          super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                          super__Vector_impl_data._M_start[1].v1 + lVar11) = iVar5;
          *(int *)((long)&((local_68._M_head_impl)->tris_).
                          super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                          super__Vector_impl_data._M_start[1].v2 + lVar11) = iVar10;
          lVar11 = lVar11 + 0x18;
          uVar7 = (ulong)((int)uVar7 + 2);
          bVar2 = iVar4 < numTheta;
          iVar4 = iVar4 + 1;
        } while (bVar2);
      }
      iVar4 = (int)uVar7;
      iVar12 = iVar12 + 1;
      iVar13 = iVar13 + 1;
    } while (iVar12 < numPhi + -2);
  }
  if (0 < numTheta) {
    lVar11 = (long)iVar4 * 0xc;
    iVar4 = 1;
    do {
      *(int *)((long)&(((local_68._M_head_impl)->tris_).
                       super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start)->v0 + lVar11) =
           (numPhi + -2) * numTheta + iVar4 % numTheta + 1;
      *(int *)((long)&(((local_68._M_head_impl)->tris_).
                       super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start)->v1 + lVar11) =
           (numPhi + -1) * numTheta + 1;
      *(int *)((long)&(((local_68._M_head_impl)->tris_).
                       super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start)->v2 + lVar11) =
           (numPhi + -2) * numTheta + iVar4;
      lVar11 = lVar11 + 0xc;
      bVar2 = iVar4 < numTheta;
      iVar4 = iVar4 + 1;
    } while (bVar2);
  }
  uVar6 = rtcNewGeometry(g_device,0x78);
  uVar3 = rtcAttachGeometry(local_40,uVar6);
  rtcSetGeometryUserPrimitiveCount
            (uVar6,(int)((ulong)((long)((local_68._M_head_impl)->tris_).
                                       super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)((local_68._M_head_impl)->tris_).
                                      super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555)
  ;
  rtcSetGeometryUserData(uVar6,uVar3);
  rtcSetGeometryBoundsFunction(uVar6,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar6,triangle_intersect_func);
  rtcCommitGeometry(uVar6);
  rtcReleaseGeometry(uVar6);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
  ::
  emplace_back<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>
            ((vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
              *)&meshes,
             (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             &local_68);
  if (local_68._M_head_impl != (Mesh *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Mesh[1])();
  }
  return uVar3;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  std::unique_ptr<collide2::Mesh> sphere (new collide2::Mesh());
  sphere->x_.resize (numTheta*(numPhi-1)+2);
  sphere->tris_.resize (2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  sphere->x_[0].x = p.x;
  sphere->x_[0].y = p.y + r;
  sphere->x_[0].z = p.z;

  for (int phi=0; phi<numPhi-1; phi++)
  {
    const float phif   = (phi+1)*float(pi)*rcpNumPhi;
    const float sinp   = sin(phif);
    const float cosp   = cos(phif);
    for (int theta=0; theta<numTheta; theta++)
    {
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      auto& v = sphere->x_[phi*(numTheta)+theta+1];
      v.x = p.x + r*sinp*sin(thetaf);
      v.y = p.y + r*cosp;
      v.z = p.z + r*sinp*cos(thetaf);
    }
  }
  sphere->x_[numTheta*(numPhi-1)+1].x = p.x;
  sphere->x_[numTheta*(numPhi-1)+1].y = p.y - r;
  sphere->x_[numTheta*(numPhi-1)+1].z = p.z;

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = theta+1;
    sphere->tris_[tri].v1 = 0;
    sphere->tris_[theta].v2 = (theta+1)%numTheta + 1;
    tri++;
  }

  for (int phi=0; phi<numPhi-2; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      int p00 = phi*numTheta + 1 + theta;
      int p01 = phi*numTheta + 1 + (theta+1)%numTheta;
      int p10 = (phi+1)*numTheta + 1 + theta;
      int p11 = (phi+1)*numTheta + 1 + (theta+1)%numTheta;

      sphere->tris_[tri].v0 = p10;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p00;
      tri++;

      sphere->tris_[tri].v0 = p11;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p10;
      tri++;
    }
  }

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = (theta+1)%numTheta + numTheta*(numPhi-2) + 1;
    sphere->tris_[tri].v1 = numTheta*(numPhi-1)+1;
    sphere->tris_[tri].v2 = theta + numTheta*(numPhi-2) + 1;
    tri++;
  }

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, sphere->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (sphere));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sphere->x_.data(),0,sizeof(collide2::vec_t),sphere->x_.size());
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sphere->tris_.data(),0,sizeof(Triangle),sphere->tris_.size ());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (sphere));
  //   return geomID;
  // }
}